

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

void __thiscall
stackjit::ClassMetadataProvider::createVirtualFunctionTables
          (ClassMetadataProvider *this,VMState *vmState)

{
  bool bVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  __node_base *p_Var4;
  
  p_Var4 = &(this->mClassesMetadata)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    bVar1 = ClassMetadata::makeVirtualFunctionTable((ClassMetadata *)(p_Var4 + 5));
    if (((bVar1) && ((vmState->config).enableDebug == true)) &&
       ((vmState->config).printVirtualFunctionTableLayout == true)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"V-table for ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 5));
      std::endl<char,std::char_traits<char>>(poVar2);
      for (p_Var3 = (_Rb_tree_node_base *)p_Var4[0x22]._M_nxt;
          p_Var3 != (_Rb_tree_node_base *)(p_Var4 + 0x20);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,p_Var3[1]._M_color);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,(string *)&p_Var3[1]._M_parent);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void ClassMetadataProvider::createVirtualFunctionTables(const VMState& vmState) {
		for (auto& current : mClassesMetadata) {
			auto& currentClass = current.second;
			auto createdVTable = currentClass.makeVirtualFunctionTable();

			if (createdVTable && vmState.config.enableDebug && vmState.config.printVirtualFunctionTableLayout) {
				std::cout << "V-table for " << currentClass.name() << std::endl;

				for (auto& virtualFunc : currentClass.virtualFunctions()) {
					std::cout << virtualFunc.first << ": " << virtualFunc.second << std::endl;
				}

				std::cout << std::endl;
			}
		}
	}